

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithAttributes
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyAttributes attributes,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  int iVar7;
  undefined4 *puVar8;
  ScriptContext *this_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  BigDictionaryTypeHandler *pBVar9;
  ThreadContext *pTVar10;
  PropertyRecord *this_02;
  char16 *varName;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_03;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar11;
  undefined1 local_80 [12];
  PropertyIds local_74;
  Type local_70;
  Var ctor;
  Type TStack_60;
  bool addingLetConstGlobal;
  PropertyRecord *propertyRecord;
  uint32 debugIndex;
  bool throwIfNotExtensible;
  bool isForce;
  ScriptContext *scriptContext;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyValueInfo *info_local;
  Type TStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  descriptor = (DictionaryPropertyDescriptor<int> *)info;
  info_local._7_1_ = attributes;
  TStack_30.ptr = (RuntimeFunction *)value;
  value_local._4_4_ = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  _debugIndex = (RuntimeFunction *)
                RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  propertyRecord._7_1_ = (flags & PropertyOperation_Force) != PropertyOperation_None;
  propertyRecord._6_1_ = (flags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None;
  if (((bool)propertyRecord._6_1_) &&
     (BVar5 = ScriptContext::IsNumericPropertyId
                        ((ScriptContext *)_debugIndex,value_local._4_4_,(uint32 *)&propertyRecord),
     BVar5 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x724,
                                "(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)))"
                                ,
                                "!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex))"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (value_local._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x726,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
  TStack_60.ptr = (RuntimeFunction *)ScriptContext::GetPropertyName(this_00,value_local._4_4_);
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_01,(PropertyRecord **)&stack0xffffffffffffffa0,
                     (DictionaryPropertyDescriptor<int> **)&scriptContext);
  if (!bVar3) {
    bVar3 = PropertyRecord::IsNumeric((PropertyRecord *)TStack_60.ptr);
    TVar2.ptr = TStack_20.ptr;
    if (!bVar3) {
      BVar5 = AddProperty(this,(DynamicObject *)TStack_20.ptr,(PropertyRecord *)TStack_60.ptr,
                          TStack_30.ptr,info_local._7_1_,(PropertyValueInfo *)descriptor,flags,
                          (bool)(propertyRecord._6_1_ & 1),possibleSideEffects);
      return BVar5;
    }
    uVar6 = PropertyRecord::GetNumericValue((PropertyRecord *)TStack_60.ptr);
    iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2e])
                      (this,TVar2.ptr,(ulong)uVar6,TStack_30.ptr,(ulong)info_local._7_1_);
    return iVar7;
  }
  bVar3 = DictionaryPropertyDescriptor<int>::SanityCheckFixedBits
                    ((DictionaryPropertyDescriptor<int> *)scriptContext);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72b,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((info_local._7_1_ &
       *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) & 0x10
      ) != 0) goto LAB_013e8a3b;
  if ((((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x800) != 0) &&
     ((info_local._7_1_ & 0x10) == 0)) {
    if (((propertyRecord._7_1_ & 1) == 0) &&
       (bVar3 = DynamicTypeHandler::VerifyIsExtensible
                          (&this->super_DynamicTypeHandler,(ScriptContext *)_debugIndex,
                           (bool)(propertyRecord._6_1_ & 1)), !bVar3)) {
      return 0;
    }
    ScriptContext::InvalidateProtoCaches((ScriptContext *)_debugIndex,value_local._4_4_);
    if (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x1000) == 0) {
      *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
           info_local._7_1_;
    }
    else {
      *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
           info_local._7_1_ |
           *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) &
           0xd0;
    }
    DictionaryPropertyDescriptor<int>::ConvertToData
              ((DictionaryPropertyDescriptor<int> *)scriptContext);
    goto LAB_013e8a3b;
  }
  bVar3 = DictionaryPropertyDescriptor<int>::GetIsShadowed
                    ((DictionaryPropertyDescriptor<int> *)scriptContext);
  if (bVar3) {
    *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
         info_local._7_1_ |
         *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) &
         0xd0;
    goto LAB_013e8a3b;
  }
  if ((*(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) & 0x10
      ) != (info_local._7_1_ & 0x10)) {
    iVar7 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    if (iVar7 <= this->nextPropertyIndex) {
      iVar7 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
      if (0x3ffffffe < iVar7) {
        pBVar9 = ConvertToBigDictionaryTypeHandler(this,(DynamicObject *)TStack_20.ptr);
        iVar7 = (*(pBVar9->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                          (pBVar9,TStack_20.ptr,(ulong)value_local._4_4_,TStack_30.ptr,
                           (ulong)info_local._7_1_,descriptor,CONCAT44(uVar11,flags),
                           (uint)possibleSideEffects);
        return iVar7;
      }
      EnsureSlotCapacity(this,(DynamicObject *)TStack_20.ptr,1);
    }
    ctor._7_1_ = (info_local._7_1_ & 0x10) != 0;
    if ((bool)ctor._7_1_) {
      *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
           *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) |
           info_local._7_1_ & 0xc0;
    }
    else {
      *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
           info_local._7_1_ |
           *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) &
           0xc0;
    }
    DictionaryPropertyDescriptor<int>::AddShadowedData
              ((DictionaryPropertyDescriptor<int> *)scriptContext,&this->nextPropertyIndex,
               (bool)ctor._7_1_);
    iVar7 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
    if (iVar7 < this->nextPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x765,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if ((ctor._7_1_ & 1) != 0) {
      DynamicObject::ChangeType((DynamicObject *)TStack_20.ptr);
    }
    goto LAB_013e8a3b;
  }
  bVar3 = DictionaryPropertyDescriptor<int>::GetIsAccessor
                    ((DictionaryPropertyDescriptor<int> *)scriptContext);
  if ((bVar3) && ((info_local._7_1_ & 0x10) == 0)) {
    local_70.ptr = (RuntimeFunction *)
                   Js::JavascriptOperators::GetProperty
                             (TStack_20.ptr,0x67,_debugIndex,(PropertyValueInfo *)0x0);
    bVar4 = VarIs<Js::RootObjectBase,Js::DynamicObject>((DynamicObject *)TStack_20.ptr);
    TVar2.ptr = TStack_20.ptr;
    bVar3 = true;
    if (!bVar4) {
      PropertyIds::PropertyIds(&local_74,value_local._4_4_);
      bVar4 = JavascriptFunction::IsBuiltinProperty(TVar2.ptr,local_74);
      bVar3 = true;
      if (!bVar4) {
        BVar5 = Js::JavascriptOperators::IsClassConstructor(TStack_20.ptr);
        if ((BVar5 == 0) &&
           (BVar5 = Js::JavascriptOperators::IsClassConstructor(local_70.ptr), BVar5 == 0)) {
          BVar5 = Js::JavascriptOperators::IsClassMethod(local_70.ptr);
          bVar3 = false;
          if (BVar5 == 0) goto LAB_013e8919;
        }
        bVar3 = (info_local._7_1_ & 6) == 6;
      }
    }
LAB_013e8919:
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x78a,
                                  "(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) || ((JavascriptOperators::IsClassConstructor(instance) || JavascriptOperators::IsClassConstructor(ctor) || JavascriptOperators::IsClassMethod(ctor)) && (attributes & (0x02|0x04)) == (0x02|0x04)))"
                                  ,
                                  "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x200) == 0) {
      if ((ScriptContext *)_debugIndex != (ScriptContext *)0x0) {
        pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)_debugIndex);
        bVar3 = ThreadContext::RecordImplicitException(pTVar10);
        TVar2.ptr = _debugIndex;
        if (bVar3) {
          pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)_debugIndex);
          this_02 = ThreadContext::GetPropertyName(pTVar10,value_local._4_4_);
          varName = PropertyRecord::GetBuffer(this_02);
          JavascriptError::ThrowTypeError((ScriptContext *)TVar2.ptr,-0x7ff5ec2a,varName);
        }
      }
      return 0;
    }
    DictionaryPropertyDescriptor<int>::ConvertToData
              ((DictionaryPropertyDescriptor<int> *)scriptContext);
    DynamicObject::ChangeType((DynamicObject *)TStack_20.ptr);
  }
  *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) =
       info_local._7_1_ |
       *(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1) & 0x10
  ;
LAB_013e8a3b:
  if ((info_local._7_1_ & 0x10) == 0) {
    SetPropertyWithDescriptor<false>
              (this,(DynamicObject *)TStack_20.ptr,(PropertyRecord *)TStack_60.ptr,
               (DictionaryPropertyDescriptor<int> **)&scriptContext,TStack_30.ptr,flags,
               (PropertyValueInfo *)descriptor);
  }
  else {
    SetPropertyWithDescriptor<true>
              (this,(DynamicObject *)TStack_20.ptr,(PropertyRecord *)TStack_60.ptr,
               (DictionaryPropertyDescriptor<int> **)&scriptContext,TStack_30.ptr,flags,
               (PropertyValueInfo *)descriptor);
  }
  if (scriptContext != (ScriptContext *)0x0) {
    if (((ulong)(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo & 0x100) != 0) {
      DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)TStack_20.ptr,false);
    }
    RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)local_80);
    this_03 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )local_80);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
              (this_03,&this->super_DynamicTypeHandler,
               *(PropertyAttributes *)
                ((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + 1),
               value_local._4_4_,(ScriptContext *)_debugIndex);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,value_local._4_4_,
             TStack_30.ptr,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

#ifdef DEBUG
        uint32 debugIndex;
        Assert(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)));
#endif
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (attributes & descriptor->Attributes & PropertyLetConstGlobal)
            {
                // Do not need to change the descriptor or its attributes if setting the initial value of a LetConstGlobal
            }
            else if (descriptor->Attributes & PropertyDeleted && !(attributes & PropertyLetConstGlobal))
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }

                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = attributes;
                }
                descriptor->ConvertToData();
            }
            else if (descriptor->GetIsShadowed())
            {
                descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
            }
            else if ((descriptor->Attributes & PropertyLetConstGlobal) != (attributes & PropertyLetConstGlobal))
            {
                // We could potentially need 1 new slot by AddShadowedData(), try pre-reserve
                if (this->GetSlotCapacity() <= nextPropertyIndex)
                {
                    if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
                    {
                        return ConvertToBigDictionaryTypeHandler(instance)->SetPropertyWithAttributes(
                            instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }

                    this->EnsureSlotCapacity(instance);
                }

                bool addingLetConstGlobal = (attributes & PropertyLetConstGlobal) != 0;

                if (addingLetConstGlobal)
                {
                    descriptor->Attributes = descriptor->Attributes | (attributes & PropertyNoRedecl);
                }
                else
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & PropertyNoRedecl);
                }

                descriptor->AddShadowedData(nextPropertyIndex, addingLetConstGlobal);

                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved above

                if (addingLetConstGlobal)
                {
                    // If shadowing a global property with a let/const, need to invalidate
                    // JIT fast path cache since look up could now go to the let/const instead
                    // of the global property.
                    //
                    // Do not need to invalidate when adding a global property that gets shadowed
                    // by an existing let/const, since all caches will still be correct.
                    instance->ChangeType();
                }
            }
            else
            {
                if (descriptor->GetIsAccessor() && !(attributes & PropertyLetConstGlobal))
                {
#if DEBUG
                    Var ctor = JavascriptOperators::GetProperty(instance, PropertyIds::constructor, scriptContext);
#endif
                    AssertMsg(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) ||
                        // ValidateAndApplyPropertyDescriptor says to preserve Configurable and Enumerable flags

                        // For InitRootFld, which is equivalent to
                        // CreateGlobalFunctionBinding called from GlobalDeclarationInstantiation in the spec,
                        // we can assume that the attributes specified include enumerable and writable.  Thus
                        // we don't need to preserve the original values of these two attributes and therefore
                        // do not need to change InitRootFld from being a SetPropertyWithAttributes API call to
                        // something else.  All we need to do is convert the descriptor to a data descriptor.
                        // Built-in Function.prototype properties 'length', 'arguments', and 'caller' are special cases.

                        ((JavascriptOperators::IsClassConstructor(instance) // Static method
                            || JavascriptOperators::IsClassConstructor(ctor)
                            || JavascriptOperators::IsClassMethod(ctor))
                            && (attributes & PropertyClassMemberDefaults) == PropertyClassMemberDefaults),
                        // 14.3.9: InitClassMember sets property descriptor to {writable:true, enumerable:false, configurable:true}

                        "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property");
                    if (!(descriptor->Attributes & PropertyConfigurable))
                    {
                        if (scriptContext && scriptContext->GetThreadContext()->RecordImplicitException())
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable, scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
                        }
                        return FALSE;
                    }
                    descriptor->ConvertToData();
                    instance->ChangeType();
                }

                // Make sure to keep the PropertyLetConstGlobal bit as is while taking the new attributes.
                descriptor->Attributes = attributes | (descriptor->Attributes & PropertyLetConstGlobal);
            }

            if (attributes & PropertyLetConstGlobal)
            {
                SetPropertyWithDescriptor<true>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            else
            {
                SetPropertyWithDescriptor<false>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            if (descriptor != nullptr)  //descriptor can dissappear, so this reference may not exist.
            {
                if (descriptor->Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);
            }

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, throwIfNotExtensible, possibleSideEffects);
    }